

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

Names * __thiscall
cmGeneratorTarget::GetLibraryNames
          (Names *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  string *psVar1;
  cmMakefile *this_00;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  char *version;
  char *version_00;
  string prefix;
  string suffix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Names::Names(__return_storage_ptr__);
  if (this->Target->IsImportedTarget == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&prefix,"GetLibraryNames called on imported target: ",
               (allocator<char> *)&suffix);
    std::__cxx11::string::append((string *)&prefix);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,&prefix);
    std::__cxx11::string::~string((string *)&prefix);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&prefix,"VERSION",(allocator<char> *)&suffix);
  pcVar4 = GetProperty(this,&prefix);
  std::__cxx11::string::~string((string *)&prefix);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&prefix,"SOVERSION",(allocator<char> *)&suffix);
  version = GetProperty(this,&prefix);
  std::__cxx11::string::~string((string *)&prefix);
  bVar2 = HasSOName(this,config);
  if (bVar2) {
    this_00 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&prefix,"CMAKE_PLATFORM_NO_VERSIONED_SONAME",(allocator<char> *)&suffix);
    bVar2 = cmMakefile::IsOn(this_00,&prefix);
    bVar3 = true;
    if (!bVar2) {
      bVar3 = IsFrameworkOnApple(this);
    }
    std::__cxx11::string::~string((string *)&prefix);
    if (bVar3 != false) {
      version = (char *)0x0;
      pcVar4 = (char *)0x0;
    }
  }
  else {
    version = (char *)0x0;
    pcVar4 = (char *)0x0;
  }
  version_00 = pcVar4;
  if (version != (char *)0x0) {
    version_00 = version;
  }
  if (pcVar4 == (char *)0x0) {
    version_00 = version;
  }
  if (version_00 == (char *)0x0) {
    version = pcVar4;
  }
  if (pcVar4 != (char *)0x0) {
    version = pcVar4;
  }
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  prefix._M_string_length = 0;
  prefix.field_2._M_local_buf[0] = '\0';
  suffix._M_dataplus._M_p = (pointer)&suffix.field_2;
  suffix._M_string_length = 0;
  suffix.field_2._M_local_buf[0] = '\0';
  GetFullNameInternal(this,config,RuntimeBinaryArtifact,&prefix,&__return_storage_ptr__->Base,
                      &suffix);
  std::operator+(&local_50,&prefix,&__return_storage_ptr__->Base);
  std::operator+(&local_70,&local_50,&suffix);
  psVar1 = &__return_storage_ptr__->Output;
  std::__cxx11::string::operator=((string *)psVar1,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  bVar2 = IsFrameworkOnApple(this);
  if (bVar2) {
    psVar1 = &__return_storage_ptr__->Real;
    std::__cxx11::string::_M_assign((string *)psVar1);
    bVar2 = cmMakefile::PlatformIsAppleEmbedded(this->Makefile);
    if (!bVar2) {
      std::__cxx11::string::append((char *)psVar1);
      GetFrameworkVersion_abi_cxx11_(&local_70,this);
      std::__cxx11::string::append((string *)psVar1);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::append((char *)psVar1);
    }
    std::__cxx11::string::append((string *)psVar1);
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->SharedObject);
  }
  else {
    ComputeVersionedName
              (this,&__return_storage_ptr__->SharedObject,&prefix,&__return_storage_ptr__->Base,
               &suffix,psVar1,version_00);
    ComputeVersionedName
              (this,&__return_storage_ptr__->Real,&prefix,&__return_storage_ptr__->Base,&suffix,
               psVar1,version);
  }
  if ((this->Target->TargetTypeValue & ~STATIC_LIBRARY) == SHARED_LIBRARY) {
    GetFullNameInternal(&local_70,this,config,ImportLibraryArtifact);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->ImportLibrary,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  GetPDBName(&local_70,this,config);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->PDB,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&suffix);
  std::__cxx11::string::~string((string *)&prefix);
  return __return_storage_ptr__;
}

Assistant:

cmGeneratorTarget::Names cmGeneratorTarget::GetLibraryNames(
  const std::string& config) const
{
  cmGeneratorTarget::Names targetNames;

  // This should not be called for imported targets.
  // TODO: Split cmTarget into a class hierarchy to get compile-time
  // enforcement of the limited imported target API.
  if (this->IsImported()) {
    std::string msg = "GetLibraryNames called on imported target: ";
    msg += this->GetName();
    this->LocalGenerator->IssueMessage(MessageType::INTERNAL_ERROR, msg);
  }

  // Check for library version properties.
  const char* version = this->GetProperty("VERSION");
  const char* soversion = this->GetProperty("SOVERSION");
  if (!this->HasSOName(config) ||
      this->Makefile->IsOn("CMAKE_PLATFORM_NO_VERSIONED_SONAME") ||
      this->IsFrameworkOnApple()) {
    // Versioning is supported only for shared libraries and modules,
    // and then only when the platform supports an soname flag.
    version = nullptr;
    soversion = nullptr;
  }
  if (version && !soversion) {
    // The soversion must be set if the library version is set.  Use
    // the library version as the soversion.
    soversion = version;
  }
  if (!version && soversion) {
    // Use the soversion as the library version.
    version = soversion;
  }

  // Get the components of the library name.
  std::string prefix;
  std::string suffix;
  this->GetFullNameInternal(config, cmStateEnums::RuntimeBinaryArtifact,
                            prefix, targetNames.Base, suffix);

  // The library name.
  targetNames.Output = prefix + targetNames.Base + suffix;

  if (this->IsFrameworkOnApple()) {
    targetNames.Real = prefix;
    if (!this->Makefile->PlatformIsAppleEmbedded()) {
      targetNames.Real += "Versions/";
      targetNames.Real += this->GetFrameworkVersion();
      targetNames.Real += "/";
    }
    targetNames.Real += targetNames.Base;
    targetNames.SharedObject = targetNames.Real;
  } else {
    // The library's soname.
    this->ComputeVersionedName(targetNames.SharedObject, prefix,
                               targetNames.Base, suffix, targetNames.Output,
                               soversion);

    // The library's real name on disk.
    this->ComputeVersionedName(targetNames.Real, prefix, targetNames.Base,
                               suffix, targetNames.Output, version);
  }

  // The import library name.
  if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
      this->GetType() == cmStateEnums::MODULE_LIBRARY) {
    targetNames.ImportLibrary =
      this->GetFullNameInternal(config, cmStateEnums::ImportLibraryArtifact);
  }

  // The program database file name.
  targetNames.PDB = this->GetPDBName(config);

  return targetNames;
}